

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_dictionary.cpp
# Opt level: O2

void duckdb_brotli::BrotliSharedDictionaryDestroyInstance(BrotliSharedDictionaryInternal *dict)

{
  brotli_free_func UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if (dict != (BrotliSharedDictionaryInternal *)0x0) {
    UNRECOVERED_JUMPTABLE = dict->free_func;
    pvVar1 = dict->memory_manager_opaque;
    (*UNRECOVERED_JUMPTABLE)(pvVar1,dict->words_instances);
    (*UNRECOVERED_JUMPTABLE)(pvVar1,dict->transforms_instances);
    (*UNRECOVERED_JUMPTABLE)(pvVar1,dict->prefix_suffix_maps);
    (*UNRECOVERED_JUMPTABLE)(pvVar1,dict);
    return;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliSharedDictionaryDestroyInstance(
    BrotliSharedDictionary* dict) {
  if (!dict) {
    return;
  } else {
    brotli_free_func free_func = dict->free_func;
    void* opaque = dict->memory_manager_opaque;
    /* Cleanup. */
    free_func(opaque, dict->words_instances);
    free_func(opaque, dict->transforms_instances);
    free_func(opaque, dict->prefix_suffix_maps);
    /* Self-destruction. */
    free_func(opaque, dict);
  }
}